

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O1

Quaternion *
AML::integrateQuat(Quaternion *__return_storage_ptr__,Quaternion *quat,Quaternion *quatRates,
                  double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = (quatRates->field_0).data[1];
  dVar2 = (quatRates->field_0).data[2];
  dVar3 = (quatRates->field_0).data[3];
  dVar4 = (quat->field_0).data[1];
  dVar5 = (quat->field_0).data[2];
  dVar6 = (quat->field_0).data[3];
  (__return_storage_ptr__->field_0).data[0] =
       (quatRates->field_0).data[0] * dt + (quat->field_0).data[0];
  (__return_storage_ptr__->field_0).data[1] = dVar1 * dt + dVar4;
  (__return_storage_ptr__->field_0).data[2] = dVar2 * dt + dVar5;
  (__return_storage_ptr__->field_0).data[3] = dt * dVar3 + dVar6;
  normalise(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Quaternion integrateQuat(const Quaternion& quat, const Quaternion& quatRates, double dt)
    {
        Quaternion quatNew = quat + quatRates * dt; // First Order Euler Integration
        normalise(quatNew);                         // Normalisation
        return quatNew;
    }